

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

int __thiscall pbrt::DisneyMaterial::writeTo(DisneyMaterial *this,BinaryWriter *binary)

{
  BinaryWriter *in_RSI;
  BinaryWriter *in_RDI;
  
  Material::writeTo((Material *)in_RSI,in_RDI);
  BinaryWriter::write<float>(in_RSI,(float *)in_RDI);
  BinaryWriter::write<float>(in_RSI,(float *)in_RDI);
  BinaryWriter::write<float>(in_RSI,(float *)in_RDI);
  BinaryWriter::write<pbrt::math::vec3f>(in_RSI,(vec3f *)in_RDI);
  BinaryWriter::write<float>(in_RSI,(float *)in_RDI);
  BinaryWriter::write<float>(in_RSI,(float *)in_RDI);
  BinaryWriter::write<float>(in_RSI,(float *)in_RDI);
  BinaryWriter::write<float>(in_RSI,(float *)in_RDI);
  BinaryWriter::write<float>(in_RSI,(float *)in_RDI);
  BinaryWriter::write<float>(in_RSI,(float *)in_RDI);
  BinaryWriter::write<float>(in_RSI,(float *)in_RDI);
  BinaryWriter::write<float>(in_RSI,(float *)in_RDI);
  BinaryWriter::write<float>(in_RSI,(float *)in_RDI);
  BinaryWriter::write<bool>(in_RSI,(bool *)in_RDI);
  return 0xb;
}

Assistant:

int DisneyMaterial::writeTo(BinaryWriter &binary) 
  {
    Material::writeTo(binary);
    binary.write(anisotropic);
    binary.write(clearCoat);
    binary.write(clearCoatGloss);
    binary.write(color);
    binary.write(diffTrans);
    binary.write(eta);
    binary.write(flatness);
    binary.write(metallic);
    binary.write(roughness);
    binary.write(sheen);
    binary.write(sheenTint);
    binary.write(specTrans);
    binary.write(specularTint);
    binary.write(thin);
    return TYPE_DISNEY_MATERIAL;
  }